

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deffunc.cpp
# Opt level: O2

ObjectPtr __thiscall ICM::DefFunc::Calc::Mod::func(Mod *this,DataList *list)

{
  DataObject<(ICM::DefaultType)8> *this_00;
  long in_RDX;
  Rational<long> RVar1;
  Type local_20;
  
  RVar1 = Common::Number::mod<long>
                    (*(long **)(**(long **)(in_RDX + 8) + 8),
                     *(long **)((*(long **)(in_RDX + 8))[1] + 8));
  this_00 = (DataObject<(ICM::DefaultType)8> *)operator_new(0x10);
  local_20 = RVar1._numerator;
  Objects::DataObject<(ICM::DefaultType)8>::DataObject(this_00,&local_20);
  (this->super_FI)._vptr_FuncInitObject = (_func_int **)this_00;
  return (ObjectPtr)(Object *)this;
}

Assistant:

ObjectPtr func(const DataList &list) const {
					const auto &rr = Common::Number::mod(list[0]->dat<T_Number>(), list[1]->dat<T_Number>());
					return ObjectPtr(new Number((int_t)rr.num()));
				}